

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O3

void duckdb_bind_add_result_column(duckdb_bind_info info,char *name,duckdb_logical_type type)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  bool bVar1;
  size_t sVar2;
  LogicalTypeId local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (type != (duckdb_logical_type)0x0 && (name != (char *)0x0 && info != (duckdb_bind_info)0x0)) {
    local_51 = INVALID;
    local_50._M_dataplus._M_p = (pointer)&local_51;
    bVar1 = duckdb::TypeVisitor::
            Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                      ((LogicalType *)type,(anon_class_8_1_50811320 *)&local_50);
    if (!bVar1) {
      local_51 = ANY;
      local_50._M_dataplus._M_p = (pointer)&local_51;
      bVar1 = duckdb::TypeVisitor::
              Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                        ((LogicalType *)type,(anon_class_8_1_50811320 *)&local_50);
      if (!bVar1) {
        this = *(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> **)(info + 0x18);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar2 = strlen(name);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (*(vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> **)
                    (info + 0x10),(value_type *)type);
      }
    }
  }
  return;
}

Assistant:

void duckdb_bind_add_result_column(duckdb_bind_info info, const char *name, duckdb_logical_type type) {
	if (!info || !name || !type) {
		return;
	}
	auto logical_type = reinterpret_cast<duckdb::LogicalType *>(type);
	if (duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::INVALID) ||
	    duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::ANY)) {
		return;
	}

	auto &bind_info = GetCBindInfo(info);
	bind_info.names.push_back(name);
	bind_info.return_types.push_back(*logical_type);
}